

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall ON_Xform::IsNan(ON_Xform *this)

{
  ulong uVar1;
  ulong uVar2;
  double *x;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (0x7f < uVar2) break;
    uVar1 = uVar2 + 8;
  } while (!NAN(*(double *)((long)this->m_xform[0] + uVar2)));
  return uVar2 < 0x80;
}

Assistant:

bool ON_Xform::IsNan() const
{
  const double* x = &m_xform[0][0];
  const double* x16 = x + 16;
  while ( x < x16 )
  {
    const double t = *x++;
    if (!(t == t))
      return true; // t is a nan
  }
  return false;
}